

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSwitch.c
# Opt level: O2

Aig_CMan_t * Aig_CManCreate(Aig_Man_t *p)

{
  ulong uVar1;
  ulong uVar2;
  Aig_CMan_t *p_00;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  p_00 = Aig_CManStart(p->nObjs[2],p->nObjs[6] + p->nObjs[5],p->nObjs[3]);
  for (iVar4 = 0; iVar4 < p->vObjs->nSize; iVar4 = iVar4 + 1) {
    pvVar3 = Vec_PtrEntry(p->vObjs,iVar4);
    if ((pvVar3 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7)) {
      uVar1 = *(ulong *)((long)pvVar3 + 8);
      uVar5 = 0xfffffffe;
      uVar6 = uVar5;
      if (uVar1 != 0) {
        uVar6 = *(int *)((uVar1 & 0xfffffffffffffffe) + 0x24) * 2;
      }
      uVar2 = *(ulong *)((long)pvVar3 + 0x10);
      if (uVar2 != 0) {
        uVar5 = *(int *)((uVar2 & 0xfffffffffffffffe) + 0x24) * 2;
      }
      Aig_CManAddNode(p_00,uVar6 | (uint)uVar1 & 1,(uint)uVar2 & 1 | uVar5);
    }
  }
  for (iVar4 = 0; iVar4 < p->vCos->nSize; iVar4 = iVar4 + 1) {
    pvVar3 = Vec_PtrEntry(p->vCos,iVar4);
    uVar1 = *(ulong *)((long)pvVar3 + 8);
    uVar6 = 0xfffffffe;
    if (uVar1 != 0) {
      uVar6 = *(int *)((uVar1 & 0xfffffffffffffffe) + 0x24) * 2;
    }
    Aig_CManAddPo(p_00,(uint)uVar1 & 1 | uVar6);
  }
  printf("\nBytes alloc = %5d.  Bytes used = %7d.  Ave per node = %4.2f. \n",
         (double)(long)(p_00->pCur + (-0x28 - (long)p_00)) / (double)(p_00->nOuts + p_00->nNodes),
         (ulong)(uint)p_00->nBytes);
  return p_00;
}

Assistant:

Aig_CMan_t * Aig_CManCreate( Aig_Man_t * p )
{
    Aig_CMan_t * pCMan;
    Aig_Obj_t * pObj;
    int i;
    pCMan = Aig_CManStart( Aig_ManCiNum(p), Aig_ManNodeNum(p), Aig_ManCoNum(p) );
    Aig_ManForEachNode( p, pObj, i )
        Aig_CManAddNode( pCMan, 
            (Aig_ObjFaninId0(pObj) << 1) | Aig_ObjFaninC0(pObj), 
            (Aig_ObjFaninId1(pObj) << 1) | Aig_ObjFaninC1(pObj) );
    Aig_ManForEachCo( p, pObj, i )
        Aig_CManAddPo( pCMan, 
            (Aig_ObjFaninId0(pObj) << 1) | Aig_ObjFaninC0(pObj) ); 
    printf( "\nBytes alloc = %5d.  Bytes used = %7d.  Ave per node = %4.2f. \n", 
        pCMan->nBytes, (int)(pCMan->pCur - pCMan->Data), 
        1.0 * (pCMan->pCur - pCMan->Data) / (pCMan->nNodes + pCMan->nOuts ) );
//    Aig_CManStop( pCMan );
    return pCMan;
}